

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.cpp
# Opt level: O0

void peparse::IterImpVAString(parsed_pe_conflict *pe,iterVAStr cb,void *cbd)

{
  bool bVar1;
  int iVar2;
  list<peparse::importent,_std::allocator<peparse::importent>_> *this;
  reference piVar3;
  undefined1 local_88 [8];
  importent i;
  iterator __end1;
  iterator __begin1;
  list<peparse::importent,_std::allocator<peparse::importent>_> *__range1;
  list<peparse::importent,_std::allocator<peparse::importent>_> *l;
  void *cbd_local;
  iterVAStr cb_local;
  parsed_pe_conflict *pe_local;
  
  this = &pe->internal->imports;
  __end1 = std::__cxx11::list<peparse::importent,_std::allocator<peparse::importent>_>::begin(this);
  i.moduleName.field_2._8_8_ =
       std::__cxx11::list<peparse::importent,_std::allocator<peparse::importent>_>::end(this);
  while( true ) {
    bVar1 = std::operator!=(&__end1,(_Self *)((long)&i.moduleName.field_2 + 8));
    if (!bVar1) {
      return;
    }
    piVar3 = std::_List_iterator<peparse::importent>::operator*(&__end1);
    importent::importent((importent *)local_88,piVar3);
    iVar2 = (*cb)(cbd,(VA)local_88,(string *)((long)&i.symbolName.field_2 + 8),(string *)&i);
    importent::~importent((importent *)local_88);
    if (iVar2 != 0) break;
    std::_List_iterator<peparse::importent>::operator++(&__end1);
  }
  return;
}

Assistant:

void IterImpVAString(parsed_pe *pe, iterVAStr cb, void *cbd) {
  list<importent> &l = pe->internal->imports;

  for (importent i : l) {
    if (cb(cbd, i.addr, i.moduleName, i.symbolName) != 0) {
      break;
    }
  }

  return;
}